

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

void __thiscall google::protobuf::UnknownFieldSet::ClearFallback(UnknownFieldSet *this)

{
  bool bVar1;
  LogMessage *pLVar2;
  Arena *pAVar3;
  reference this_00;
  int local_40;
  int n;
  LogMessage local_28;
  Voidify local_11;
  UnknownFieldSet *local_10;
  UnknownFieldSet *this_local;
  
  local_10 = this;
  bVar1 = RepeatedField<google::protobuf::UnknownField>::empty(&this->fields_);
  if (bVar1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set.cc"
               ,0x27,"!fields_.empty()");
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_28);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_11,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_28);
  }
  pAVar3 = arena(this);
  if (pAVar3 == (Arena *)0x0) {
    local_40 = RepeatedField<google::protobuf::UnknownField>::size(&this->fields_);
    do {
      local_40 = local_40 + -1;
      this_00 = RepeatedField<google::protobuf::UnknownField>::operator[](&this->fields_,local_40);
      UnknownField::Delete(this_00);
    } while (0 < local_40);
  }
  RepeatedField<google::protobuf::UnknownField>::Clear(&this->fields_);
  return;
}

Assistant:

void UnknownFieldSet::ClearFallback() {
  ABSL_DCHECK(!fields_.empty());
  if (arena() == nullptr) {
    int n = fields_.size();
    do {
      (fields_)[--n].Delete();
    } while (n > 0);
  }
  fields_.Clear();
}